

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryRunCommand.cxx
# Opt level: O0

bool __thiscall
cmTryRunCommand::InitialPass
          (cmTryRunCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argv,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  WorkingMode WVar3;
  size_type sVar4;
  cmake *pcVar5;
  const_reference pvVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  string *local_258;
  byte local_22a;
  bool local_1da;
  allocator local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  char *local_170;
  char *compileOutput;
  string local_160;
  allocator local_139;
  string local_138;
  undefined1 local_118 [8];
  string runOutputContents;
  int res;
  allocator local_c9;
  value_type local_c8;
  byte local_a1;
  undefined4 local_a0;
  uint uStack_9c;
  bool captureRunOutput;
  undefined1 local_98 [4];
  uint i;
  string runArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tryCompile;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *argv_local;
  cmTryRunCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)argv;
  argv_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(argv);
  if (sVar4 < 4) {
    this_local._7_1_ = 0;
  }
  else {
    pcVar5 = cmMakefile::GetCMakeInstance((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
    WVar3 = cmake::GetWorkingMode(pcVar5);
    if (WVar3 == FIND_PACKAGE_MODE) {
      pcVar1 = (this->super_cmCoreTryCompile).super_cmCommand.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_48,
                 "The TRY_RUN() command is not supported in --find-package mode.",&local_49);
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      this_local._7_1_ = 0;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&runArgs.field_2 + 8));
      std::__cxx11::string::operator=((string *)&this->CompileResultVariable,"");
      std::__cxx11::string::operator=((string *)&this->RunResultVariable,"");
      std::__cxx11::string::operator=((string *)&this->OutputVariable,"");
      std::__cxx11::string::operator=((string *)&this->RunOutputVariable,"");
      std::__cxx11::string::operator=((string *)&this->CompileOutputVariable,"");
      std::__cxx11::string::string((string *)local_98);
      for (uStack_9c = 1; uVar8 = (ulong)uStack_9c,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local), uVar8 < sVar4; uStack_9c = uStack_9c + 1) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(ulong)uStack_9c);
        bVar2 = std::operator==(pvVar6,"ARGS");
        if (bVar2) {
          while( true ) {
            uStack_9c = uStack_9c + 1;
            uVar8 = (ulong)uStack_9c;
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local);
            local_1da = false;
            if (uVar8 < sVar4) {
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_2_local,(ulong)uStack_9c);
              bVar2 = std::operator!=(pvVar6,"COMPILE_DEFINITIONS");
              local_1da = false;
              if (bVar2) {
                pvVar6 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_2_local,(ulong)uStack_9c);
                bVar2 = std::operator!=(pvVar6,"CMAKE_FLAGS");
                local_1da = false;
                if (bVar2) {
                  pvVar6 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)param_2_local,(ulong)uStack_9c);
                  local_1da = std::operator!=(pvVar6,"LINK_LIBRARIES");
                }
              }
            }
            if (local_1da == false) break;
            std::__cxx11::string::operator+=((string *)local_98," ");
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)uStack_9c);
            std::__cxx11::string::operator+=((string *)local_98,(string *)pvVar6);
          }
          uVar8 = (ulong)uStack_9c;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local);
          if (uVar8 < sVar4) {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)uStack_9c);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&runArgs.field_2 + 8),pvVar6);
          }
        }
        else {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local,(ulong)uStack_9c);
          bVar2 = std::operator==(pvVar6,"OUTPUT_VARIABLE");
          if (bVar2) {
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local);
            if (sVar4 <= uStack_9c + 1) {
              cmSystemTools::Error
                        ("OUTPUT_VARIABLE specified but there is no variable",(char *)0x0,
                         (char *)0x0,(char *)0x0);
              this_local._7_1_ = 0;
              goto LAB_005317e0;
            }
            uStack_9c = uStack_9c + 1;
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)uStack_9c);
            std::__cxx11::string::operator=((string *)&this->OutputVariable,(string *)pvVar6);
          }
          else {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(ulong)uStack_9c);
            bVar2 = std::operator==(pvVar6,"RUN_OUTPUT_VARIABLE");
            if (bVar2) {
              sVar4 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)param_2_local);
              if (sVar4 <= uStack_9c + 1) {
                cmSystemTools::Error
                          ("RUN_OUTPUT_VARIABLE specified but there is no variable",(char *)0x0,
                           (char *)0x0,(char *)0x0);
                this_local._7_1_ = 0;
                goto LAB_005317e0;
              }
              uStack_9c = uStack_9c + 1;
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_2_local,(ulong)uStack_9c);
              std::__cxx11::string::operator=((string *)&this->RunOutputVariable,(string *)pvVar6);
            }
            else {
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_2_local,(ulong)uStack_9c);
              bVar2 = std::operator==(pvVar6,"COMPILE_OUTPUT_VARIABLE");
              if (bVar2) {
                sVar4 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)param_2_local);
                if (sVar4 <= uStack_9c + 1) {
                  cmSystemTools::Error
                            ("COMPILE_OUTPUT_VARIABLE specified but there is no variable",
                             (char *)0x0,(char *)0x0,(char *)0x0);
                  this_local._7_1_ = 0;
                  goto LAB_005317e0;
                }
                uStack_9c = uStack_9c + 1;
                pvVar6 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_2_local,(ulong)uStack_9c);
                std::__cxx11::string::operator=
                          ((string *)&this->CompileOutputVariable,(string *)pvVar6);
              }
              else {
                pvVar6 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_2_local,(ulong)uStack_9c);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&runArgs.field_2 + 8),pvVar6);
              }
            }
          }
        }
      }
      lVar7 = std::__cxx11::string::size();
      if ((lVar7 == 0) ||
         ((uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) != 0 &&
          (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) != 0)))) {
        local_a1 = 0;
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          local_a1 = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_c8,"OUTPUT_VARIABLE",&local_c9);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&runArgs.field_2 + 8),&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_c9);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&runArgs.field_2 + 8),&this->OutputVariable);
        }
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&res,"OUTPUT_VARIABLE",
                     (allocator *)(runOutputContents.field_2._M_local_buf + 0xf));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&runArgs.field_2 + 8),(value_type *)&res);
          std::__cxx11::string::~string((string *)&res);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(runOutputContents.field_2._M_local_buf + 0xf));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&runArgs.field_2 + 8),&this->CompileOutputVariable);
        }
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          local_a1 = 1;
        }
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,0);
        std::__cxx11::string::operator=((string *)&this->RunResultVariable,(string *)pvVar6);
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,1);
        std::__cxx11::string::operator=((string *)&this->CompileResultVariable,(string *)pvVar6);
        runOutputContents.field_2._8_4_ =
             cmCoreTryCompile::TryCompileCode
                       (&this->super_cmCoreTryCompile,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&runArgs.field_2 + 8));
        if (runOutputContents.field_2._8_4_ == 0) {
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            std::__cxx11::string::string((string *)local_118);
            pcVar1 = (this->super_cmCoreTryCompile).super_cmCommand.Makefile;
            std::allocator<char>::allocator();
            compileOutput._6_1_ = 0;
            compileOutput._5_1_ = 0;
            std::__cxx11::string::string((string *)&local_138,"CMAKE_CROSSCOMPILING",&local_139);
            bVar2 = cmMakefile::IsOn(pcVar1,&local_138);
            local_22a = 0;
            if (bVar2) {
              pcVar1 = (this->super_cmCoreTryCompile).super_cmCommand.Makefile;
              std::allocator<char>::allocator();
              compileOutput._6_1_ = 1;
              std::__cxx11::string::string
                        ((string *)&local_160,"CMAKE_CROSSCOMPILING_EMULATOR",
                         (allocator *)((long)&compileOutput + 7));
              compileOutput._5_1_ = 1;
              bVar2 = cmMakefile::IsDefinitionSet(pcVar1,&local_160);
              local_22a = bVar2 ^ 0xff;
            }
            if ((compileOutput._5_1_ & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_160);
            }
            if ((compileOutput._6_1_ & 1) != 0) {
              std::allocator<char>::~allocator((allocator<char> *)((long)&compileOutput + 7));
            }
            std::__cxx11::string::~string((string *)&local_138);
            std::allocator<char>::~allocator((allocator<char> *)&local_139);
            if ((local_22a & 1) == 0) {
              RunExecutable(this,(string *)local_98,(string *)local_118);
            }
            else {
              pvVar6 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_2_local,3);
              if ((local_a1 & 1) == 0) {
                local_258 = (string *)0x0;
              }
              else {
                local_258 = (string *)local_118;
              }
              DoNotRunExecutable(this,(string *)local_98,pvVar6,local_258);
            }
            uVar8 = std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              pcVar1 = (this->super_cmCoreTryCompile).super_cmCommand.Makefile;
              pcVar9 = (char *)std::__cxx11::string::c_str();
              cmMakefile::AddDefinition(pcVar1,&this->RunOutputVariable,pcVar9);
            }
            uVar8 = std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              pcVar9 = cmMakefile::GetDefinition
                                 ((this->super_cmCoreTryCompile).super_cmCommand.Makefile,
                                  &this->OutputVariable);
              local_170 = pcVar9;
              if (pcVar9 != (char *)0x0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_1b0,pcVar9,&local_1b1);
                std::operator+(&local_190,&local_1b0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_118);
                std::__cxx11::string::operator=((string *)local_118,(string *)&local_190);
                std::__cxx11::string::~string((string *)&local_190);
                std::__cxx11::string::~string((string *)&local_1b0);
                std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
              }
              pcVar1 = (this->super_cmCoreTryCompile).super_cmCommand.Makefile;
              pcVar9 = (char *)std::__cxx11::string::c_str();
              cmMakefile::AddDefinition(pcVar1,&this->OutputVariable,pcVar9);
            }
            std::__cxx11::string::~string((string *)local_118);
          }
          else {
            pcVar9 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Error(pcVar9,(char *)0x0,(char *)0x0,(char *)0x0);
          }
        }
        pcVar5 = cmMakefile::GetCMakeInstance
                           ((this->super_cmCoreTryCompile).super_cmCommand.Makefile);
        bVar2 = cmake::GetDebugTryCompile(pcVar5);
        if (!bVar2) {
          pcVar9 = (char *)std::__cxx11::string::c_str();
          cmCoreTryCompile::CleanupFiles(&this->super_cmCoreTryCompile,pcVar9);
        }
        this_local._7_1_ = 1;
      }
      else {
        cmSystemTools::Error
                  ("You cannot use OUTPUT_VARIABLE together with COMPILE_OUTPUT_VARIABLE or RUN_OUTPUT_VARIABLE. Please use only COMPILE_OUTPUT_VARIABLE and/or RUN_OUTPUT_VARIABLE."
                   ,(char *)0x0,(char *)0x0,(char *)0x0);
        this_local._7_1_ = 0;
      }
LAB_005317e0:
      local_a0 = 1;
      std::__cxx11::string::~string((string *)local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&runArgs.field_2 + 8));
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmTryRunCommand
::InitialPass(std::vector<std::string> const& argv, cmExecutionStatus &)
{
  if(argv.size() < 4)
    {
    return false;
    }

  if(this->Makefile->GetCMakeInstance()->GetWorkingMode() ==
                                                      cmake::FIND_PACKAGE_MODE)
    {
    this->Makefile->IssueMessage(cmake::FATAL_ERROR,
            "The TRY_RUN() command is not supported in --find-package mode.");
    return false;
    }

  // build an arg list for TryCompile and extract the runArgs,
  std::vector<std::string> tryCompile;

  this->CompileResultVariable = "";
  this->RunResultVariable = "";
  this->OutputVariable = "";
  this->RunOutputVariable = "";
  this->CompileOutputVariable = "";

  std::string runArgs;
  unsigned int i;
  for (i = 1; i < argv.size(); ++i)
    {
    if (argv[i] == "ARGS")
      {
      ++i;
      while (i < argv.size() && argv[i] != "COMPILE_DEFINITIONS" &&
             argv[i] != "CMAKE_FLAGS" &&
             argv[i] != "LINK_LIBRARIES")
        {
        runArgs += " ";
        runArgs += argv[i];
        ++i;
        }
      if (i < argv.size())
        {
        tryCompile.push_back(argv[i]);
        }
      }
    else
      {
      if (argv[i] == "OUTPUT_VARIABLE")
        {
        if ( argv.size() <= (i+1) )
          {
          cmSystemTools::Error(
            "OUTPUT_VARIABLE specified but there is no variable");
          return false;
          }
        i++;
        this->OutputVariable = argv[i];
        }
      else if (argv[i] == "RUN_OUTPUT_VARIABLE")
        {
        if (argv.size() <= (i + 1))
          {
          cmSystemTools::Error(
            "RUN_OUTPUT_VARIABLE specified but there is no variable");
          return false;
          }
        i++;
        this->RunOutputVariable = argv[i];
        }
      else if (argv[i] == "COMPILE_OUTPUT_VARIABLE")
        {
        if (argv.size() <= (i + 1))
          {
          cmSystemTools::Error(
            "COMPILE_OUTPUT_VARIABLE specified but there is no variable");
          return false;
          }
        i++;
        this->CompileOutputVariable = argv[i];
        }
      else
        {
        tryCompile.push_back(argv[i]);
        }
      }
    }

  // although they could be used together, don't allow it, because
  // using OUTPUT_VARIABLE makes crosscompiling harder
  if (this->OutputVariable.size()
      && (!this->RunOutputVariable.empty()
       || !this->CompileOutputVariable.empty()))
    {
    cmSystemTools::Error(
      "You cannot use OUTPUT_VARIABLE together with COMPILE_OUTPUT_VARIABLE "
      "or RUN_OUTPUT_VARIABLE. Please use only COMPILE_OUTPUT_VARIABLE and/or "
      "RUN_OUTPUT_VARIABLE.");
    return false;
    }

  bool captureRunOutput = false;
  if (!this->OutputVariable.empty())
    {
    captureRunOutput = true;
    tryCompile.push_back("OUTPUT_VARIABLE");
    tryCompile.push_back(this->OutputVariable);
    }
  if (!this->CompileOutputVariable.empty())
    {
    tryCompile.push_back("OUTPUT_VARIABLE");
    tryCompile.push_back(this->CompileOutputVariable);
    }
  if (!this->RunOutputVariable.empty())
    {
    captureRunOutput = true;
    }

  this->RunResultVariable = argv[0];
  this->CompileResultVariable = argv[1];

  // do the try compile
  int res = this->TryCompileCode(tryCompile);

  // now try running the command if it compiled
  if (!res)
    {
    if (this->OutputFile.empty())
      {
      cmSystemTools::Error(this->FindErrorMessage.c_str());
      }
    else
      {
      // "run" it and capture the output
      std::string runOutputContents;
      if (this->Makefile->IsOn("CMAKE_CROSSCOMPILING") &&
          !this->Makefile->IsDefinitionSet("CMAKE_CROSSCOMPILING_EMULATOR"))
        {
        this->DoNotRunExecutable(runArgs,
                                 argv[3],
                                 captureRunOutput ? &runOutputContents : 0);
        }
      else
        {
        this->RunExecutable(runArgs, &runOutputContents);
        }

      // now put the output into the variables
      if(!this->RunOutputVariable.empty())
        {
        this->Makefile->AddDefinition(this->RunOutputVariable,
                                      runOutputContents.c_str());
        }

      if(!this->OutputVariable.empty())
        {
        // if the TryCompileCore saved output in this outputVariable then
        // prepend that output to this output
        const char* compileOutput
                 = this->Makefile->GetDefinition(this->OutputVariable);
        if (compileOutput)
          {
          runOutputContents = std::string(compileOutput) + runOutputContents;
          }
        this->Makefile->AddDefinition(this->OutputVariable,
                                      runOutputContents.c_str());
        }
      }
    }

  // if we created a directory etc, then cleanup after ourselves
  if(!this->Makefile->GetCMakeInstance()->GetDebugTryCompile())
    {
    this->CleanupFiles(this->BinaryDirectory.c_str());
    }
  return true;
}